

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O1

ngx_int_t ngx_ext_rename_file(ngx_str_t *src,ngx_str_t *to,ngx_ext_rename_file_t *ext)

{
  ngx_atomic_t nVar1;
  size_t sVar2;
  u_char *puVar3;
  int iVar4;
  int iVar5;
  ngx_int_t nVar6;
  int *piVar7;
  ngx_log_t *pnVar8;
  u_char *puVar9;
  char *fmt;
  undefined1 local_68 [8];
  ngx_copy_file_t cf;
  
  if ((ext->access == 0) || (iVar4 = chmod((char *)src->data,(__mode_t)ext->access), iVar4 != -1)) {
    if ((ext->time == -1) || (nVar6 = ngx_set_file_time(src->data,ext->fd,ext->time), nVar6 == 0)) {
      iVar4 = rename((char *)src->data,(char *)to->data);
      if (iVar4 != -1) {
        return 0;
      }
      pnVar8 = (ngx_log_t *)__errno_location();
      iVar4 = (int)pnVar8->log_level;
      if (iVar4 == 2) {
        iVar4 = 2;
        if ((ext->field_0x1c & 1) == 0) goto LAB_0011af68;
        iVar5 = ngx_create_full_path
                          (to->data,(ulong)((uint)(ext->path_access >> 2) & 0x49) | ext->path_access
                          );
        if (iVar5 != 0) {
          pnVar8 = ext->log;
          if (2 < pnVar8->log_level) {
            puVar9 = to->data;
            fmt = "mkdir() \"%s\" failed";
            goto LAB_0011aef9;
          }
          goto LAB_0011af65;
        }
        iVar4 = rename((char *)src->data,(char *)to->data);
        if (iVar4 != -1) {
          return 0;
        }
        iVar4 = (int)pnVar8->log_level;
      }
      if (iVar4 == 0x12) {
        local_68 = (undefined1  [8])0xffffffffffffffff;
        cf.size = 0;
        cf.buf_size = ext->access;
        cf.access = ext->time;
        cf.time = (time_t)ext->log;
        cf.log = pnVar8;
        puVar9 = (u_char *)ngx_alloc(to->len + 0xc,(ngx_log_t *)cf.time);
        if (puVar9 == (u_char *)0x0) {
          return -1;
        }
        sVar2 = to->len;
        puVar3 = to->data;
        LOCK();
        nVar1 = *ngx_temp_number;
        *ngx_temp_number = *ngx_temp_number + 1;
        UNLOCK();
        iVar4 = 0;
        ngx_sprintf(puVar9,"%*s.%010uD%Z",sVar2,puVar3,(ulong)((int)nVar1 + 1));
        nVar6 = ngx_copy_file(src->data,puVar9,(ngx_copy_file_t *)local_68);
        if (nVar6 == 0) {
          iVar5 = rename((char *)puVar9,(char *)to->data);
          if (iVar5 != -1) {
            free(puVar9);
            iVar4 = unlink((char *)src->data);
            if (iVar4 != -1) {
              return 0;
            }
            if (2 < ext->log->log_level) {
              ngx_log_error_core(3,ext->log,(ngx_err_t)(cf.log)->log_level,"unlink() \"%s\" failed",
                                 src->data);
              return -1;
            }
            return -1;
          }
          if (2 < ext->log->log_level) {
            ngx_log_error_core(3,ext->log,(ngx_err_t)(cf.log)->log_level,
                               "rename() \"%s\" to \"%s\" failed",puVar9,to->data);
          }
          iVar5 = unlink((char *)puVar9);
          if ((iVar5 == -1) && (2 < ext->log->log_level)) {
            ngx_log_error_core(3,ext->log,(ngx_err_t)(cf.log)->log_level,"unlink() \"%s\" failed",
                               puVar9);
          }
        }
        free(puVar9);
      }
      goto LAB_0011af68;
    }
    pnVar8 = ext->log;
    if (2 < pnVar8->log_level) {
      piVar7 = __errno_location();
      iVar5 = *piVar7;
      puVar9 = src->data;
      fmt = "utimes() \"%s\" failed";
      goto LAB_0011aef9;
    }
  }
  else {
    pnVar8 = ext->log;
    if (2 < pnVar8->log_level) {
      piVar7 = __errno_location();
      iVar5 = *piVar7;
      puVar9 = src->data;
      fmt = "chmod() \"%s\" failed";
LAB_0011aef9:
      iVar4 = 0;
      ngx_log_error_core(3,pnVar8,iVar5,fmt,puVar9);
      goto LAB_0011af68;
    }
  }
LAB_0011af65:
  iVar4 = 0;
LAB_0011af68:
  if ((((ext->field_0x1c & 2) != 0) && (iVar5 = unlink((char *)src->data), iVar5 == -1)) &&
     (pnVar8 = ext->log, 2 < pnVar8->log_level)) {
    piVar7 = __errno_location();
    ngx_log_error_core(3,pnVar8,*piVar7,"unlink() \"%s\" failed",src->data);
  }
  if ((iVar4 != 0) && (2 < ext->log->log_level)) {
    ngx_log_error_core(3,ext->log,iVar4,"rename() \"%s\" to \"%s\" failed",src->data,to->data);
  }
  return -1;
}

Assistant:

ngx_int_t
ngx_ext_rename_file(ngx_str_t *src, ngx_str_t *to, ngx_ext_rename_file_t *ext)
{
    u_char           *name;
    ngx_err_t         err;
    ngx_copy_file_t   cf;

#if !(NGX_WIN32)

    if (ext->access) {
        if (ngx_change_file_access(src->data, ext->access) == NGX_FILE_ERROR) {
            ngx_log_error(NGX_LOG_CRIT, ext->log, ngx_errno,
                          ngx_change_file_access_n " \"%s\" failed", src->data);
            err = 0;
            goto failed;
        }
    }

#endif

    if (ext->time != -1) {
        if (ngx_set_file_time(src->data, ext->fd, ext->time) != NGX_OK) {
            ngx_log_error(NGX_LOG_CRIT, ext->log, ngx_errno,
                          ngx_set_file_time_n " \"%s\" failed", src->data);
            err = 0;
            goto failed;
        }
    }

    if (ngx_rename_file(src->data, to->data) != NGX_FILE_ERROR) {
        return NGX_OK;
    }

    err = ngx_errno;

    if (err == NGX_ENOPATH) {

        if (!ext->create_path) {
            goto failed;
        }

        err = ngx_create_full_path(to->data, ngx_dir_access(ext->path_access));

        if (err) {
            ngx_log_error(NGX_LOG_CRIT, ext->log, err,
                          ngx_create_dir_n " \"%s\" failed", to->data);
            err = 0;
            goto failed;
        }

        if (ngx_rename_file(src->data, to->data) != NGX_FILE_ERROR) {
            return NGX_OK;
        }

        err = ngx_errno;
    }

#if (NGX_WIN32)

    if (err == NGX_EEXIST || err == NGX_EEXIST_FILE) {
        err = ngx_win32_rename_file(src, to, ext->log);

        if (err == 0) {
            return NGX_OK;
        }
    }

#endif

    if (err == NGX_EXDEV) {

        cf.size = -1;
        cf.buf_size = 0;
        cf.access = ext->access;
        cf.time = ext->time;
        cf.log = ext->log;

        name = ngx_alloc(to->len + 1 + 10 + 1, ext->log);
        if (name == NULL) {
            return NGX_ERROR;
        }

        (void) ngx_sprintf(name, "%*s.%010uD%Z", to->len, to->data,
                           (uint32_t) ngx_next_temp_number(0));

        if (ngx_copy_file(src->data, name, &cf) == NGX_OK) {

            if (ngx_rename_file(name, to->data) != NGX_FILE_ERROR) {
                ngx_free(name);

                if (ngx_delete_file(src->data) == NGX_FILE_ERROR) {
                    ngx_log_error(NGX_LOG_CRIT, ext->log, ngx_errno,
                                  ngx_delete_file_n " \"%s\" failed",
                                  src->data);
                    return NGX_ERROR;
                }

                return NGX_OK;
            }

            ngx_log_error(NGX_LOG_CRIT, ext->log, ngx_errno,
                          ngx_rename_file_n " \"%s\" to \"%s\" failed",
                          name, to->data);

            if (ngx_delete_file(name) == NGX_FILE_ERROR) {
                ngx_log_error(NGX_LOG_CRIT, ext->log, ngx_errno,
                              ngx_delete_file_n " \"%s\" failed", name);

            }
        }

        ngx_free(name);

        err = 0;
    }

failed:

    if (ext->delete_file) {
        if (ngx_delete_file(src->data) == NGX_FILE_ERROR) {
            ngx_log_error(NGX_LOG_CRIT, ext->log, ngx_errno,
                          ngx_delete_file_n " \"%s\" failed", src->data);
        }
    }

    if (err) {
        ngx_log_error(NGX_LOG_CRIT, ext->log, err,
                      ngx_rename_file_n " \"%s\" to \"%s\" failed",
                      src->data, to->data);
    }

    return NGX_ERROR;
}